

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# URResolution.cpp
# Opt level: O1

void __thiscall
Inferences::URResolution::Item::Item
          (Item *this,Clause *cl,bool selectedOnly,URResolution *parent,bool mustResolveAll)

{
  Literal **ppLVar1;
  uint uVar2;
  Literal *pLVar3;
  Clause **ppCVar4;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  ulong s;
  uint uVar8;
  bool bVar9;
  
  this->_orig = cl;
  if ((~*(uint *)&cl->field_0x38 & 0x300000) == 0) {
    Kernel::Clause::computeColor(cl);
  }
  this->_color = *(uint *)&cl->field_0x38 >> 0x14 & COLOR_INVALID;
  (this->_premises)._size = 0;
  (this->_premises)._capacity = 0;
  (this->_premises)._array = (Clause **)0x0;
  (this->_lits)._capacity = 0;
  (this->_lits)._stack = (Literal **)0x0;
  (this->_lits)._cursor = (Literal **)0x0;
  (this->_lits)._end = (Literal **)0x0;
  this->_parent = parent;
  uVar6 = *(ulong *)&cl->field_0x38;
  if (*(int *)(::Lib::env + 0x8898) == 2) {
    pLVar3 = Kernel::Clause::getAnswerLiteral(cl);
  }
  else {
    pLVar3 = (Literal *)0x0;
  }
  uVar8 = (uint)uVar6;
  uVar5 = uVar8 & 0xfffff;
  this->_ansLit = pLVar3;
  this->_mustResolveAll = uVar5 < (pLVar3 == (Literal *)0x0 ^ 3) || (mustResolveAll || selectedOnly)
  ;
  uVar5 = uVar5 - (pLVar3 != (Literal *)0x0);
  s = (ulong)uVar5;
  ::Lib::DArray<Kernel::Clause_*>::ensure(&this->_premises,s);
  if (uVar5 != 0) {
    ppCVar4 = (this->_premises)._array + s;
    do {
      ppCVar4[-1] = (Clause *)0x0;
      ppCVar4 = ppCVar4 + -1;
    } while (ppCVar4 != (this->_premises)._array);
  }
  ::Lib::Stack<Kernel::Literal_*>::reserve(&this->_lits,s);
  if ((uVar6 & 0xfffff) == 0) {
    bVar9 = true;
  }
  else {
    uVar6 = 0;
    uVar7 = 0;
    do {
      pLVar3 = cl->_literals[uVar6];
      if (pLVar3 != this->_ansLit) {
        if ((this->_lits)._cursor == (this->_lits)._end) {
          ::Lib::Stack<Kernel::Literal_*>::expand(&this->_lits);
        }
        *(this->_lits)._cursor = pLVar3;
        ppLVar1 = (this->_lits)._cursor;
        (this->_lits)._cursor = ppLVar1 + 1;
        uVar2 = Kernel::Term::numVarOccs(&(*ppLVar1)->super_Term);
        uVar7 = (uVar7 + 1) - (uint)(uVar2 == 0);
      }
      uVar6 = uVar6 + 1;
    } while ((uVar8 & 0xfffff) != uVar6);
    bVar9 = uVar7 < 2;
  }
  this->_atMostOneNonGround = bVar9;
  if (selectedOnly) {
    uVar5 = *(uint *)&cl->field_0x3c & 0xfffff;
  }
  this->_activeLength = uVar5;
  return;
}

Assistant:

Item(Clause* cl, bool selectedOnly, URResolution& parent, bool mustResolveAll)
  : _orig(cl), _color(cl->color()), _parent(parent)
  {
    unsigned clen = cl->length();
    bool synthesis = (env.options->questionAnswering() == Options::QuestionAnsweringMode::SYNTHESIS);
    _ansLit = synthesis ? cl->getAnswerLiteral() : nullptr;
    _mustResolveAll = mustResolveAll || (selectedOnly ? true : (clen < 2 + (_ansLit ? 1 : 0)));
    unsigned litslen = clen - (_ansLit ? 1 : 0);
    _premises.init(litslen, 0);
    _lits.reserve(litslen);
    unsigned nonGroundCnt = 0;
    for(unsigned i=0; i<clen; i++) {
      if ((*cl)[i] != _ansLit) {
        _lits.push((*cl)[i]);
        if(!_lits.top()->ground()) nonGroundCnt++;
      }
    }
    _atMostOneNonGround = nonGroundCnt<=1;

    _activeLength = selectedOnly ? cl->numSelected() : litslen;
    ASS_REP2(_activeLength>=litslen-1, cl->toString(), cl->numSelected());
  }